

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjCollectInternalCut_rec(Gia_Man_t *p,int iObj)

{
  Vec_Int_t *p_00;
  uint uVar1;
  
  if (-1 < iObj) {
    if (iObj < p->vTtNums->nSize) {
      if (-1000000000 < p->vTtNums->pArray[(uint)iObj]) {
        return;
      }
      if (iObj < p->nObjs) {
        uVar1 = (uint)*(undefined8 *)(p->pObjs + (uint)iObj);
        if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                        ,0x16c,"void Gia_ObjCollectInternalCut_rec(Gia_Man_t *, int)");
        }
        Gia_ObjCollectInternalCut_rec(p,iObj - (uVar1 & 0x1fffffff));
        if (iObj < p->nObjs) {
          Gia_ObjCollectInternalCut_rec
                    (p,iObj - (*(uint *)&p->pObjs[(uint)iObj].field_0x4 & 0x1fffffff));
          if (iObj < p->vTtNums->nSize) {
            p_00 = p->vTtNodes;
            p->vTtNums->pArray[(uint)iObj] = p_00->nSize;
            Vec_IntPush(p_00,iObj);
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
      }
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ObjCollectInternalCut_rec( Gia_Man_t * p, int iObj )
{
    if ( Gia_ObjHasNumId(p, iObj) )
        return;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjCollectInternalCut_rec( p, Gia_ObjFaninId1(Gia_ManObj(p, iObj), iObj) );
    Gia_ObjSetNumId( p, iObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, iObj );
}